

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<false>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  Geometry *this;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ulong uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  byte bVar33;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar34;
  bool bVar35;
  long lVar36;
  byte bVar37;
  byte bVar38;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar39;
  size_t sVar40;
  size_t i;
  bool bVar41;
  ulong uVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar60 [64];
  long lStack_24e0;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar56 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar5 = (context->query_radius).field_0;
    auVar55 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
    auVar56 = ZEXT1664(auVar55);
  }
  pSVar39 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar53._4_4_ = fVar1;
  auVar53._0_4_ = fVar1;
  auVar53._8_4_ = fVar1;
  auVar53._12_4_ = fVar1;
  auVar53._16_4_ = fVar1;
  auVar53._20_4_ = fVar1;
  auVar53._24_4_ = fVar1;
  auVar53._28_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar54._4_4_ = fVar2;
  auVar54._0_4_ = fVar2;
  auVar54._8_4_ = fVar2;
  auVar54._12_4_ = fVar2;
  auVar54._16_4_ = fVar2;
  auVar54._20_4_ = fVar2;
  auVar54._24_4_ = fVar2;
  auVar54._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar57._4_4_ = fVar3;
  auVar57._0_4_ = fVar3;
  auVar57._8_4_ = fVar3;
  auVar57._12_4_ = fVar3;
  auVar57._16_4_ = fVar3;
  auVar57._20_4_ = fVar3;
  auVar57._24_4_ = fVar3;
  auVar57._28_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar49._4_4_ = uVar4;
  auVar49._0_4_ = uVar4;
  auVar49._8_4_ = uVar4;
  auVar49._12_4_ = uVar4;
  auVar49._16_4_ = uVar4;
  auVar49._20_4_ = uVar4;
  auVar49._24_4_ = uVar4;
  auVar49._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar51._4_4_ = uVar4;
  auVar51._0_4_ = uVar4;
  auVar51._8_4_ = uVar4;
  auVar51._12_4_ = uVar4;
  auVar51._16_4_ = uVar4;
  auVar51._20_4_ = uVar4;
  auVar51._24_4_ = uVar4;
  auVar51._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar46._4_4_ = uVar4;
  auVar46._0_4_ = uVar4;
  auVar46._8_4_ = uVar4;
  auVar46._12_4_ = uVar4;
  auVar46._16_4_ = uVar4;
  auVar46._20_4_ = uVar4;
  auVar46._24_4_ = uVar4;
  auVar46._28_4_ = uVar4;
  bVar35 = false;
  auVar23 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar58 = ZEXT3264(auVar23);
  auVar59 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar23 = vsubps_avx(auVar53,auVar49);
    fVar12 = auVar49._0_4_;
    fVar13 = auVar49._4_4_;
    fVar14 = auVar49._8_4_;
    fVar15 = auVar49._12_4_;
    fVar16 = auVar49._16_4_;
    fVar17 = auVar49._20_4_;
    fVar18 = auVar49._24_4_;
    auVar19 = vsubps_avx(auVar54,auVar51);
    auVar20 = vsubps_avx(auVar57,auVar46);
    auVar52._0_4_ = fVar3 + auVar46._0_4_;
    auVar52._4_4_ = fVar3 + auVar46._4_4_;
    auVar52._8_4_ = fVar3 + auVar46._8_4_;
    auVar52._12_4_ = fVar3 + auVar46._12_4_;
    auVar52._16_4_ = fVar3 + auVar46._16_4_;
    auVar52._20_4_ = fVar3 + auVar46._20_4_;
    auVar52._24_4_ = fVar3 + auVar46._24_4_;
    auVar52._28_4_ = fVar3 + auVar46._28_4_;
    auVar60._0_4_ = fVar12 * fVar12;
    auVar60._4_4_ = fVar13 * fVar13;
    auVar60._8_4_ = fVar14 * fVar14;
    auVar60._12_4_ = fVar15 * fVar15;
    auVar60._16_4_ = fVar16 * fVar16;
    auVar60._20_4_ = fVar17 * fVar17;
    auVar60._28_36_ = in_ZMM15._28_36_;
    auVar60._24_4_ = fVar18 * fVar18;
    auVar55 = auVar56._0_16_;
LAB_01c7ad68:
    do {
      if (pSVar39 == stack) {
        return bVar35;
      }
      pSVar34 = pSVar39 + -1;
      pSVar39 = pSVar39 + -1;
    } while (auVar56._0_4_ < (float)pSVar34->dist);
    sVar40 = (pSVar39->ptr).ptr;
LAB_01c7ad84:
    while (context->query_type != POINT_QUERY_TYPE_SPHERE) {
      if ((sVar40 & 8) != 0) goto LAB_01c7b1b5;
      auVar46 = *(undefined1 (*) [32])(sVar40 + 0x40);
      auVar21 = *(undefined1 (*) [32])(sVar40 + 0x60);
      auVar43 = vmaxps_avx(auVar53,auVar46);
      auVar43 = vminps_avx(auVar43,auVar21);
      auVar45 = vsubps_avx(auVar43,auVar53);
      auVar43 = vmaxps_avx(auVar54,*(undefined1 (*) [32])(sVar40 + 0x80));
      auVar43 = vminps_avx(auVar43,*(undefined1 (*) [32])(sVar40 + 0xa0));
      auVar44 = vsubps_avx(auVar43,auVar54);
      auVar43 = vmaxps_avx(auVar57,*(undefined1 (*) [32])(sVar40 + 0xc0));
      auVar43 = vminps_avx(auVar43,*(undefined1 (*) [32])(sVar40 + 0xe0));
      auVar43 = vsubps_avx(auVar43,auVar57);
      auVar50._0_4_ =
           auVar45._0_4_ * auVar45._0_4_ + auVar44._0_4_ * auVar44._0_4_ +
           auVar43._0_4_ * auVar43._0_4_;
      auVar50._4_4_ =
           auVar45._4_4_ * auVar45._4_4_ + auVar44._4_4_ * auVar44._4_4_ +
           auVar43._4_4_ * auVar43._4_4_;
      auVar50._8_4_ =
           auVar45._8_4_ * auVar45._8_4_ + auVar44._8_4_ * auVar44._8_4_ +
           auVar43._8_4_ * auVar43._8_4_;
      auVar50._12_4_ =
           auVar45._12_4_ * auVar45._12_4_ + auVar44._12_4_ * auVar44._12_4_ +
           auVar43._12_4_ * auVar43._12_4_;
      auVar50._16_4_ =
           auVar45._16_4_ * auVar45._16_4_ + auVar44._16_4_ * auVar44._16_4_ +
           auVar43._16_4_ * auVar43._16_4_;
      auVar50._20_4_ =
           auVar45._20_4_ * auVar45._20_4_ + auVar44._20_4_ * auVar44._20_4_ +
           auVar43._20_4_ * auVar43._20_4_;
      auVar50._24_4_ =
           auVar45._24_4_ * auVar45._24_4_ + auVar44._24_4_ * auVar44._24_4_ +
           auVar43._24_4_ * auVar43._24_4_;
      auVar50._28_4_ = auVar45._28_4_ + auVar44._28_4_ + auVar44._28_4_;
      uVar32 = vcmpps_avx512vl(auVar46,auVar21,2);
      uVar26 = vcmpps_avx512vl(auVar21,auVar23,1);
      auVar43._4_4_ = fVar1 + fVar13;
      auVar43._0_4_ = fVar1 + fVar12;
      auVar43._8_4_ = fVar1 + fVar14;
      auVar43._12_4_ = fVar1 + fVar15;
      auVar43._16_4_ = fVar1 + fVar16;
      auVar43._20_4_ = fVar1 + fVar17;
      auVar43._24_4_ = fVar1 + fVar18;
      auVar43._28_4_ = fVar1 + auVar49._28_4_;
      uVar27 = vcmpps_avx512vl(auVar46,auVar43,6);
      uVar28 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar40 + 0xa0),auVar19,1);
      auVar21._4_4_ = fVar2 + auVar51._4_4_;
      auVar21._0_4_ = fVar2 + auVar51._0_4_;
      auVar21._8_4_ = fVar2 + auVar51._8_4_;
      auVar21._12_4_ = fVar2 + auVar51._12_4_;
      auVar21._16_4_ = fVar2 + auVar51._16_4_;
      auVar21._20_4_ = fVar2 + auVar51._20_4_;
      auVar21._24_4_ = fVar2 + auVar51._24_4_;
      auVar21._28_4_ = fVar2 + auVar51._28_4_;
      uVar29 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar40 + 0x80),auVar21,6);
      uVar30 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar40 + 0xe0),auVar20,1);
      uVar31 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar40 + 0xc0),auVar52,6);
      uVar42 = (ulong)(byte)(~((byte)uVar29 | (byte)uVar27 | (byte)uVar31 | (byte)uVar26 |
                              (byte)uVar28 | (byte)uVar30) & (byte)uVar32);
LAB_01c7ae07:
      bVar38 = (byte)uVar42;
      if (bVar38 == 0) goto LAB_01c7ad68;
      auVar46 = *(undefined1 (*) [32])(sVar40 & 0xfffffffffffffff0);
      auVar21 = ((undefined1 (*) [32])(sVar40 & 0xfffffffffffffff0))[1];
      auVar43 = vpternlogd_avx512vl(auVar58._0_32_,auVar50,auVar59._0_32_,0xf8);
      auVar44 = vpcompressd_avx512vl(auVar43);
      auVar45._0_4_ = (uint)(bVar38 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar38 & 1) * auVar43._0_4_
      ;
      bVar41 = (bool)((byte)(uVar42 >> 1) & 1);
      auVar45._4_4_ = (uint)bVar41 * auVar44._4_4_ | (uint)!bVar41 * auVar43._4_4_;
      bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
      auVar45._8_4_ = (uint)bVar41 * auVar44._8_4_ | (uint)!bVar41 * auVar43._8_4_;
      bVar41 = (bool)((byte)(uVar42 >> 3) & 1);
      auVar45._12_4_ = (uint)bVar41 * auVar44._12_4_ | (uint)!bVar41 * auVar43._12_4_;
      bVar41 = (bool)((byte)(uVar42 >> 4) & 1);
      auVar45._16_4_ = (uint)bVar41 * auVar44._16_4_ | (uint)!bVar41 * auVar43._16_4_;
      bVar41 = (bool)((byte)(uVar42 >> 5) & 1);
      auVar45._20_4_ = (uint)bVar41 * auVar44._20_4_ | (uint)!bVar41 * auVar43._20_4_;
      bVar41 = (bool)((byte)(uVar42 >> 6) & 1);
      auVar45._24_4_ = (uint)bVar41 * auVar44._24_4_ | (uint)!bVar41 * auVar43._24_4_;
      bVar41 = SUB81(uVar42 >> 7,0);
      auVar45._28_4_ = (uint)bVar41 * auVar44._28_4_ | (uint)!bVar41 * auVar43._28_4_;
      auVar43 = vpermt2q_avx512vl(auVar46,auVar45,auVar21);
      sVar40 = auVar43._0_8_;
      bVar38 = bVar38 - 1 & bVar38;
      if (bVar38 != 0) goto LAB_01c7af47;
    }
    if ((sVar40 & 8) == 0) {
      auVar46 = vmaxps_avx(auVar53,*(undefined1 (*) [32])(sVar40 + 0x40));
      auVar46 = vminps_avx(auVar46,*(undefined1 (*) [32])(sVar40 + 0x60));
      auVar21 = vsubps_avx(auVar46,auVar53);
      auVar46 = vmaxps_avx(auVar54,*(undefined1 (*) [32])(sVar40 + 0x80));
      auVar46 = vminps_avx(auVar46,*(undefined1 (*) [32])(sVar40 + 0xa0));
      auVar43 = vsubps_avx(auVar46,auVar54);
      auVar46 = vmaxps_avx(auVar57,*(undefined1 (*) [32])(sVar40 + 0xc0));
      auVar46 = vminps_avx(auVar46,*(undefined1 (*) [32])(sVar40 + 0xe0));
      auVar46 = vsubps_avx(auVar46,auVar57);
      auVar50._0_4_ =
           auVar21._0_4_ * auVar21._0_4_ + auVar43._0_4_ * auVar43._0_4_ +
           auVar46._0_4_ * auVar46._0_4_;
      auVar50._4_4_ =
           auVar21._4_4_ * auVar21._4_4_ + auVar43._4_4_ * auVar43._4_4_ +
           auVar46._4_4_ * auVar46._4_4_;
      auVar50._8_4_ =
           auVar21._8_4_ * auVar21._8_4_ + auVar43._8_4_ * auVar43._8_4_ +
           auVar46._8_4_ * auVar46._8_4_;
      auVar50._12_4_ =
           auVar21._12_4_ * auVar21._12_4_ + auVar43._12_4_ * auVar43._12_4_ +
           auVar46._12_4_ * auVar46._12_4_;
      auVar50._16_4_ =
           auVar21._16_4_ * auVar21._16_4_ + auVar43._16_4_ * auVar43._16_4_ +
           auVar46._16_4_ * auVar46._16_4_;
      auVar50._20_4_ =
           auVar21._20_4_ * auVar21._20_4_ + auVar43._20_4_ * auVar43._20_4_ +
           auVar46._20_4_ * auVar46._20_4_;
      auVar50._24_4_ =
           auVar21._24_4_ * auVar21._24_4_ + auVar43._24_4_ * auVar43._24_4_ +
           auVar46._24_4_ * auVar46._24_4_;
      auVar50._28_4_ = auVar21._28_4_ + auVar43._28_4_ + auVar43._28_4_;
      uVar42 = vcmpps_avx512vl(auVar50,auVar60._0_32_,2);
      uVar25 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar40 + 0x40),
                               *(undefined1 (*) [32])(sVar40 + 0x60),2);
      uVar42 = uVar42 & uVar25;
      goto LAB_01c7ae07;
    }
LAB_01c7b1b5:
    bVar38 = 0;
    for (lVar36 = 0; in_ZMM15 = ZEXT3264(auVar60._0_32_), (ulong)((uint)sVar40 & 0xf) - 8 != lVar36;
        lVar36 = lVar36 + 1) {
      uVar6 = *(uint *)((sVar40 & 0xfffffffffffffff0) + lVar36 * 8);
      this = (context->scene->geometries).items[uVar6].ptr;
      context->geomID = uVar6;
      context->primID = *(uint *)((sVar40 & 0xfffffffffffffff0) + 4 + lVar36 * 8);
      bVar41 = Geometry::pointQuery(this,query,context);
      auVar59 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      auVar46 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar58 = ZEXT3264(auVar46);
      bVar38 = bVar38 | bVar41;
    }
    auVar56 = ZEXT1664(auVar55);
    if (bVar38 == 0) goto LAB_01c7ad68;
    uVar4 = *(undefined4 *)&(context->query_radius).field_0;
    auVar49._4_4_ = uVar4;
    auVar49._0_4_ = uVar4;
    auVar49._8_4_ = uVar4;
    auVar49._12_4_ = uVar4;
    auVar49._16_4_ = uVar4;
    auVar49._20_4_ = uVar4;
    auVar49._24_4_ = uVar4;
    auVar49._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar51._4_4_ = uVar4;
    auVar51._0_4_ = uVar4;
    auVar51._8_4_ = uVar4;
    auVar51._12_4_ = uVar4;
    auVar51._16_4_ = uVar4;
    auVar51._20_4_ = uVar4;
    auVar51._24_4_ = uVar4;
    auVar51._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar46._4_4_ = uVar4;
    auVar46._0_4_ = uVar4;
    auVar46._8_4_ = uVar4;
    auVar46._12_4_ = uVar4;
    auVar46._16_4_ = uVar4;
    auVar46._20_4_ = uVar4;
    auVar46._24_4_ = uVar4;
    auVar46._28_4_ = uVar4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar56 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar5 = (context->query_radius).field_0;
      auVar55 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar56 = ZEXT1664(auVar55);
    }
    bVar35 = true;
  } while( true );
LAB_01c7af47:
  auVar43 = vpshufd_avx2(auVar45,0x55);
  vpermt2q_avx512vl(auVar46,auVar43,auVar21);
  auVar44 = vpminsd_avx2(auVar45,auVar43);
  auVar43 = vpmaxsd_avx2(auVar45,auVar43);
  bVar38 = bVar38 - 1 & bVar38;
  if (bVar38 == 0) {
    auVar45 = vpermi2q_avx512vl(auVar44,auVar46,auVar21);
    sVar40 = auVar45._0_8_;
    auVar46 = vpermt2q_avx512vl(auVar46,auVar43,auVar21);
    (pSVar39->ptr).ptr = auVar46._0_8_;
    lVar36 = 8;
    lStack_24e0 = 0x10;
  }
  else {
    auVar24 = vpshufd_avx2(auVar45,0xaa);
    vpermt2q_avx512vl(auVar46,auVar24,auVar21);
    auVar48 = vpminsd_avx2(auVar44,auVar24);
    auVar44 = vpmaxsd_avx2(auVar44,auVar24);
    auVar24 = vpminsd_avx2(auVar43,auVar44);
    auVar44 = vpmaxsd_avx2(auVar43,auVar44);
    bVar38 = bVar38 - 1 & bVar38;
    if (bVar38 == 0) {
      auVar43 = vpermi2q_avx512vl(auVar48,auVar46,auVar21);
      sVar40 = auVar43._0_8_;
      auVar43 = vpermt2q_avx512vl(auVar46,auVar44,auVar21);
      (pSVar39->ptr).ptr = auVar43._0_8_;
      auVar43 = vpermd_avx2(auVar44,auVar50);
      pSVar39->dist = auVar43._0_4_;
      auVar46 = vpermt2q_avx512vl(auVar46,auVar24,auVar21);
      pSVar39[1].ptr.ptr = auVar46._0_8_;
      lStack_24e0 = 0x18;
      lVar36 = lStack_24e0;
      lStack_24e0 = 0x20;
      auVar43 = auVar24;
    }
    else {
      auVar43 = vpshufd_avx2(auVar45,0xff);
      vpermt2q_avx512vl(auVar46,auVar43,auVar21);
      auVar22 = vpminsd_avx2(auVar48,auVar43);
      auVar48 = vpmaxsd_avx2(auVar48,auVar43);
      auVar43 = vpminsd_avx2(auVar24,auVar48);
      auVar48 = vpmaxsd_avx2(auVar24,auVar48);
      auVar24 = vpminsd_avx2(auVar44,auVar48);
      auVar44 = vpmaxsd_avx2(auVar44,auVar48);
      bVar38 = bVar38 - 1 & bVar38;
      if (bVar38 != 0) {
        auVar47 = valignd_avx512vl(auVar45,auVar45,3);
        auVar45 = vpmovsxbd_avx2(ZEXT816(0x303020108));
        auVar48 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000))),
                                    auVar45,auVar22);
        auVar45 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
        auVar43 = vpermt2d_avx512vl(auVar48,auVar45,auVar43);
        auVar45 = vpermt2d_avx512vl(auVar43,auVar45,auVar24);
        auVar43 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
        auVar43 = vpermt2d_avx512vl(auVar45,auVar43,auVar44);
        auVar56 = ZEXT3264(auVar43);
        bVar37 = bVar38;
        do {
          auVar45 = auVar56._0_32_;
          auVar44._8_4_ = 1;
          auVar44._0_8_ = 0x100000001;
          auVar44._12_4_ = 1;
          auVar44._16_4_ = 1;
          auVar44._20_4_ = 1;
          auVar44._24_4_ = 1;
          auVar44._28_4_ = 1;
          auVar43 = vpermd_avx2(auVar44,auVar47);
          auVar47 = valignd_avx512vl(auVar47,auVar47,1);
          vpermt2q_avx512vl(auVar46,auVar47,auVar21);
          bVar37 = bVar37 - 1 & bVar37;
          uVar32 = vpcmpd_avx512vl(auVar43,auVar45,5);
          auVar43 = vpmaxsd_avx2(auVar43,auVar45);
          bVar33 = (byte)uVar32 << 1;
          auVar45 = valignd_avx512vl(auVar45,auVar45,7);
          bVar41 = (bool)((byte)uVar32 & 1);
          bVar7 = (bool)(bVar33 >> 2 & 1);
          bVar8 = (bool)(bVar33 >> 3 & 1);
          bVar9 = (bool)(bVar33 >> 4 & 1);
          bVar10 = (bool)(bVar33 >> 5 & 1);
          bVar11 = (bool)(bVar33 >> 6 & 1);
          auVar56 = ZEXT3264(CONCAT428((uint)(bVar33 >> 7) * auVar45._28_4_ |
                                       (uint)!(bool)(bVar33 >> 7) * auVar43._28_4_,
                                       CONCAT424((uint)bVar11 * auVar45._24_4_ |
                                                 (uint)!bVar11 * auVar43._24_4_,
                                                 CONCAT420((uint)bVar10 * auVar45._20_4_ |
                                                           (uint)!bVar10 * auVar43._20_4_,
                                                           CONCAT416((uint)bVar9 * auVar45._16_4_ |
                                                                     (uint)!bVar9 * auVar43._16_4_,
                                                                     CONCAT412((uint)bVar8 *
                                                                               auVar45._12_4_ |
                                                                               (uint)!bVar8 *
                                                                               auVar43._12_4_,
                                                                               CONCAT48((uint)bVar7
                                                                                        * auVar45.
                                                  _8_4_ | (uint)!bVar7 * auVar43._8_4_,
                                                  CONCAT44((uint)bVar41 * auVar45._4_4_ |
                                                           (uint)!bVar41 * auVar43._4_4_,
                                                           auVar43._0_4_))))))));
        } while (bVar37 != 0);
        lVar36 = (ulong)(uint)POPCOUNT((uint)bVar38) + 3;
        while( true ) {
          auVar45 = auVar56._0_32_;
          auVar43 = vpermt2q_avx512vl(auVar46,auVar45,auVar21);
          sVar40 = auVar43._0_8_;
          bVar41 = lVar36 == 0;
          lVar36 = lVar36 + -1;
          if (bVar41) break;
          (pSVar39->ptr).ptr = sVar40;
          auVar43 = vpermd_avx2(auVar45,auVar50);
          pSVar39->dist = auVar43._0_4_;
          auVar43 = valignd_avx512vl(auVar45,auVar45,1);
          auVar56 = ZEXT3264(auVar43);
          pSVar39 = pSVar39 + 1;
        }
        auVar56 = ZEXT1664(auVar55);
        goto LAB_01c7ad84;
      }
      auVar45 = vpermi2q_avx512vl(auVar22,auVar46,auVar21);
      sVar40 = auVar45._0_8_;
      auVar45 = vpermt2q_avx512vl(auVar46,auVar44,auVar21);
      (pSVar39->ptr).ptr = auVar45._0_8_;
      auVar45 = vpermd_avx2(auVar44,auVar50);
      pSVar39->dist = auVar45._0_4_;
      auVar45 = vpermt2q_avx512vl(auVar46,auVar24,auVar21);
      pSVar39[1].ptr.ptr = auVar45._0_8_;
      auVar45 = vpermd_avx2(auVar24,auVar50);
      pSVar39[1].dist = auVar45._0_4_;
      auVar46 = vpermt2q_avx512vl(auVar46,auVar43,auVar21);
      pSVar39[2].ptr.ptr = auVar46._0_8_;
      lVar36 = 0x28;
      lStack_24e0 = 0x30;
    }
  }
  auVar46 = vpermd_avx2(auVar43,auVar50);
  *(int *)((long)&(pSVar39->ptr).ptr + lVar36) = auVar46._0_4_;
  pSVar39 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(pSVar39->ptr).ptr + lStack_24e0);
  goto LAB_01c7ad84;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }